

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::computeFtest(SPxSolverBase<double> *this)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  SPxOut *pSVar5;
  int iVar6;
  int i;
  long lVar7;
  char *t;
  int iVar8;
  double dVar9;
  ulong extraout_XMM0_Qb;
  double dVar10;
  Verbosity old_verbosity;
  undefined4 local_50;
  Verbosity local_4c;
  double local_48;
  ulong uStack_40;
  
  dVar9 = entertol(this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViolCoUpToDate = true;
  this->m_pricingViol = 0.0;
  this->m_pricingViolCo = 0.0;
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  iVar6 = (this->thecovectors->set).thenum;
  iVar8 = (int)((double)iVar6 * this->sparsePricingFactor);
  dVar9 = -dVar9;
  uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
  iVar4 = 0;
  local_48 = dVar9;
  for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 1) {
    dVar1 = (this->theFvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7];
    dVar10 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7];
    if (dVar1 <= dVar10) {
      dVar10 = dVar1 - (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar7];
    }
    else {
      dVar10 = dVar10 - dVar1;
    }
    (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = dVar10;
    if (this->remainingRoundsLeave == 0) {
      if (dVar9 <= dVar10) {
        (this->isInfeasible).data[lVar7] = 0;
      }
      else {
        this->m_pricingViol = this->m_pricingViol - dVar10;
        DIdxSet::addIdx(&this->infeasibilities,(int)lVar7);
        (this->isInfeasible).data[lVar7] = 1;
        this->m_numViol = this->m_numViol + 1;
        dVar9 = local_48;
      }
      iVar4 = (this->infeasibilities).super_IdxSet.num;
      if (iVar8 < iVar4) {
        pSVar5 = this->spxout;
        if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
          local_50 = 4;
          local_4c = pSVar5->m_verbosity;
          (*pSVar5->_vptr_SPxOut[2])(pSVar5,&local_50);
          pSVar5 = soplex::operator<<(this->spxout," --- using dense pricing");
          std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4c);
          dVar9 = local_48;
        }
        this->remainingRoundsLeave = 5;
        this->sparsePricingLeave = false;
        (this->infeasibilities).super_IdxSet.num = 0;
        iVar4 = 0;
      }
    }
    else if (dVar10 < dVar9) {
      this->m_pricingViol = this->m_pricingViol - dVar10;
      this->m_numViol = this->m_numViol + 1;
    }
    iVar6 = (this->thecovectors->set).thenum;
  }
  if ((iVar4 == 0) && (this->sparsePricingLeave == false)) {
    this->remainingRoundsLeave = this->remainingRoundsLeave + -1;
  }
  else if ((iVar4 <= iVar8) && (this->sparsePricingLeave == false)) {
    pSVar5 = this->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (local_4c = pSVar5->m_verbosity, 3 < (int)local_4c)) {
      local_50 = 4;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = this->spxout;
      iVar6 = *(int *)(pSVar5->m_streams[pSVar5->m_verbosity] +
                      *(long *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + 8);
      t = " --- using sparse pricing, ";
      if (this->hyperPricingLeave != false) {
        t = " --- using hypersparse pricing, ";
      }
      soplex::operator<<(pSVar5,t);
      pSVar5 = soplex::operator<<(this->spxout,"sparsity: ");
      poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
      lVar7 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar7 + -0x18) + 0x10) = 6;
      *(uint *)(poVar2 + *(long *)(lVar7 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(lVar7 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar2 + *(long *)(lVar7 + -0x18) + 8) = 4;
      pSVar5 = soplex::operator<<(pSVar5,(double)this->m_numViol /
                                         (double)(this->thecovectors->set).thenum);
      poVar2 = pSVar5->m_streams[pSVar5->m_verbosity];
      lVar7 = *(long *)poVar2;
      lVar3 = *(long *)(lVar7 + -0x18);
      *(uint *)(poVar2 + lVar3 + 0x18) = *(uint *)(poVar2 + lVar3 + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar2 + *(long *)(lVar7 + -0x18) + 8) = (long)iVar6;
      std::endl<char,std::char_traits<char>>(poVar2);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_4c);
    }
    this->sparsePricingLeave = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFtest()
{

   assert(type() == LEAVE);

   R theeps = entertol();
   m_pricingViolUpToDate = true;
   m_pricingViolCoUpToDate = true;
   m_pricingViol = 0;
   m_pricingViolCo = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());

   for(int i = 0; i < dim(); ++i)
   {
      theCoTest[i] = ((*theFvec)[i] > theUBbound[i])
                     ? theUBbound[i] - (*theFvec)[i]
                     : (*theFvec)[i] - theLBbound[i];

      if(remainingRoundsLeave == 0)
      {
         if(theCoTest[i] < -theeps)
         {
            m_pricingViol -= theCoTest[i];
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
            ++m_numViol;
         }
         else
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

         if(infeasibilities.size() > sparsitythreshold)
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                          << std::endl;)
            remainingRoundsLeave = SOPLEX_DENSEROUNDS;
            sparsePricingLeave = false;
            infeasibilities.clear();
         }
      }
      else if(theCoTest[i] < -theeps)
      {
         m_pricingViol -= theCoTest[i];
         m_numViol++;
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingLeave)
   {
      --remainingRoundsLeave;
   }
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingLeave)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingLeave)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) m_numViol / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingLeave = true;
   }
}